

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

bool LEARNER::complete_multi_ex(example *ec,multi_ex *ec_seq,vw *all)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  example *local_28;
  
  local_28 = ec;
  bVar1 = (*(all->p->lp).test_label)(&ec->l);
  bVar2 = example_is_newline_not_header(ec);
  if (bVar2 && bVar1) {
    VW::finish_example(all,ec);
    if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      return true;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Something is wrong---an example with no choice.  Do you have all 0 features? Or multiple empty lines?"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::push_back(ec_seq,&local_28);
  }
  return false;
}

Assistant:

bool complete_multi_ex(example* ec, multi_ex& ec_seq, vw& all)
{
  const bool is_test_ec = all.p->lp.test_label(&ec->l);

  if (example_is_newline_not_header(*ec) && is_test_ec)
  {
    VW::finish_example(all, *ec);
    if (ec_seq.size() == 0)
    {
      cout << "Something is wrong---an example with no choice.  Do you have all 0 features? Or multiple empty lines?"
           << endl;
      return false;
    }
    return true;  // example complete
  }
  ec_seq.push_back(ec);
  return false;
}